

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathCacheNewString(xmlXPathParserContextPtr pctxt,xmlChar *val)

{
  void *pvVar1;
  long lVar2;
  xmlChar *pxVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathContextCachePtr cache;
  xmlXPathObjectPtr unaff_R15;
  
  if ((pctxt->context != (xmlXPathContextPtr)0x0) &&
     (pvVar1 = pctxt->context->cache, pvVar1 != (void *)0x0)) {
    lVar2 = *(long *)((long)pvVar1 + 8);
    if (lVar2 != 0) {
      if (val == (xmlChar *)0x0) {
        val = "";
      }
      pxVar3 = xmlStrdup(val);
      if (pxVar3 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(pctxt);
        unaff_R15 = (xmlXPathObjectPtr)0x0;
      }
      else {
        unaff_R15 = *(xmlXPathObjectPtr *)((long)pvVar1 + 8);
        *(xmlChar **)((long)pvVar1 + 8) = unaff_R15->stringval;
        *(int *)((long)pvVar1 + 0x18) = *(int *)((long)pvVar1 + 0x18) + -1;
        unaff_R15->type = XPATH_STRING;
        unaff_R15->stringval = pxVar3;
      }
    }
    if (lVar2 != 0) {
      return unaff_R15;
    }
  }
  pxVar4 = xmlXPathNewString(val);
  if (pxVar4 == (xmlXPathObjectPtr)0x0) {
    xmlXPathPErrMemory(pctxt);
  }
  return pxVar4;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewString(xmlXPathParserContextPtr pctxt, const xmlChar *val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->miscObjs != NULL) {
            xmlChar *copy;

            if (val == NULL)
                val = BAD_CAST "";
            copy = xmlStrdup(val);
            if (copy == NULL) {
                xmlXPathPErrMemory(pctxt);
                return(NULL);
            }

	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
	    ret->type = XPATH_STRING;
            ret->stringval = copy;
	    return(ret);
	}
    }

    ret = xmlXPathNewString(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}